

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall testing::TestCase::UnshuffleTests(TestCase *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar2 = _DAT_00184030;
  piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    lVar4 = lVar3 + -1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_00184030;
    auVar7 = _DAT_00184020;
    do {
      auVar8 = auVar7 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        piVar1[uVar5] = (int)uVar5;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        piVar1[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar4 + 2;
    } while ((lVar3 + 1U & 0xfffffffffffffffe) != uVar5);
  }
  return;
}

Assistant:

void TestCase::UnshuffleTests() {
  for (size_t i = 0; i < test_indices_.size(); i++) {
    test_indices_[i] = static_cast<int>(i);
  }
}